

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask1_24(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  uVar1 = *in;
  *out = uVar1;
  uVar1 = in[1] * 2 | uVar1;
  *out = uVar1;
  uVar1 = in[2] << 2 | uVar1;
  *out = uVar1;
  uVar1 = in[3] << 3 | uVar1;
  *out = uVar1;
  uVar1 = in[4] << 4 | uVar1;
  *out = uVar1;
  uVar1 = in[5] << 5 | uVar1;
  *out = uVar1;
  uVar1 = in[6] << 6 | uVar1;
  *out = uVar1;
  uVar1 = in[7] << 7 | uVar1;
  *out = uVar1;
  uVar1 = in[8] << 8 | uVar1;
  *out = uVar1;
  uVar1 = in[9] << 9 | uVar1;
  *out = uVar1;
  uVar1 = in[10] << 10 | uVar1;
  *out = uVar1;
  uVar1 = in[0xb] << 0xb | uVar1;
  *out = uVar1;
  uVar1 = in[0xc] << 0xc | uVar1;
  *out = uVar1;
  uVar1 = in[0xd] << 0xd | uVar1;
  *out = uVar1;
  uVar1 = in[0xe] << 0xe | uVar1;
  *out = uVar1;
  uVar1 = in[0xf] << 0xf | uVar1;
  *out = uVar1;
  uVar1 = in[0x10] << 0x10 | uVar1;
  *out = uVar1;
  uVar1 = in[0x11] << 0x11 | uVar1;
  *out = uVar1;
  uVar1 = in[0x12] << 0x12 | uVar1;
  *out = uVar1;
  uVar1 = in[0x13] << 0x13 | uVar1;
  *out = uVar1;
  uVar1 = in[0x14] << 0x14 | uVar1;
  *out = uVar1;
  uVar1 = in[0x15] << 0x15 | uVar1;
  *out = uVar1;
  uVar1 = in[0x16] << 0x16 | uVar1;
  *out = uVar1;
  *out = in[0x17] << 0x17 | uVar1;
  return out + 1;
}

Assistant:

uint32_t *__fastpackwithoutmask1_24(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 11;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 17;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 19;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 21;
  ++in;
  *out |= ((*in)) << 22;
  ++in;
  *out |= ((*in)) << 23;
  ++in;

  return out + 1;
}